

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::readCharProc(Kvm *vm,Value *args)

{
  bool bVar1;
  Value *local_40;
  istream *local_38;
  char local_29;
  istream *piStack_28;
  char c;
  istream *stream;
  InputPort *ip;
  Value *args_local;
  Kvm *vm_local;
  
  stream = (istream *)args;
  ip = (InputPort *)args;
  args_local = (Value *)vm;
  if (args == vm->NIL) {
    local_38 = (istream *)&std::cin;
  }
  else {
    local_38 = (istream *)
               std::
               unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)(args + 1));
  }
  piStack_28 = local_38;
  std::operator>>(local_38,&local_29);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(piStack_28 + *(long *)(*(long *)piStack_28 + -0x18)));
  if (bVar1) {
    local_40 = args_local[9].next_;
  }
  else {
    local_40 = makeChar((Kvm *)args_local,local_29);
  }
  return local_40;
}

Assistant:

const Value* Kvm::readCharProc(Kvm *vm, const Value *args)
{
    const InputPort *ip = static_cast<const InputPort *>(args);
    std::istream &stream = args == vm->NIL ? std::cin : *ip->input;

    char c;
    stream >> c;
    return stream ? vm->EOFOBJ : vm->makeChar(c);
}